

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3RenameMethod(sqlite3_vtab *pVtab,char *zName)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int local_2c;
  sqlite3 *psStack_28;
  int rc;
  sqlite3 *db;
  Fts3Table *p;
  char *zName_local;
  sqlite3_vtab *pVtab_local;
  
  psStack_28 = (sqlite3 *)pVtab[1].pModule;
  db = (sqlite3 *)pVtab;
  p = (Fts3Table *)zName;
  zName_local = (char *)pVtab;
  local_2c = fts3SetHasStat((Fts3Table *)pVtab);
  if (local_2c == 0) {
    local_2c = sqlite3Fts3PendingTermsFlush((Fts3Table *)db);
  }
  lVar1._0_4_ = db->errCode;
  lVar1._4_4_ = db->errMask;
  if (lVar1 == 0) {
    uVar2._0_4_ = db->nDb;
    uVar2._4_4_ = db->mDbFlags;
    fts3DbExec(&local_2c,psStack_28,"ALTER TABLE %Q.\'%q_content\'  RENAME TO \'%q_content\';",
               db->aDb,uVar2,p);
  }
  if (*(char *)((long)&db->nVTrans + 2) != '\0') {
    uVar3._0_4_ = db->nDb;
    uVar3._4_4_ = db->mDbFlags;
    fts3DbExec(&local_2c,psStack_28,"ALTER TABLE %Q.\'%q_docsize\'  RENAME TO \'%q_docsize\';",
               db->aDb,uVar3,p);
  }
  if (*(char *)((long)&db->nVTrans + 1) != '\0') {
    uVar4._0_4_ = db->nDb;
    uVar4._4_4_ = db->mDbFlags;
    fts3DbExec(&local_2c,psStack_28,"ALTER TABLE %Q.\'%q_stat\'  RENAME TO \'%q_stat\';",db->aDb,
               uVar4,p);
  }
  uVar5._0_4_ = db->nDb;
  uVar5._4_4_ = db->mDbFlags;
  fts3DbExec(&local_2c,psStack_28,"ALTER TABLE %Q.\'%q_segments\' RENAME TO \'%q_segments\';",
             db->aDb,uVar5,p);
  uVar6._0_4_ = db->nDb;
  uVar6._4_4_ = db->mDbFlags;
  fts3DbExec(&local_2c,psStack_28,"ALTER TABLE %Q.\'%q_segdir\'   RENAME TO \'%q_segdir\';",db->aDb,
             uVar6,p);
  return local_2c;
}

Assistant:

static int fts3RenameMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  const char *zName               /* New name of table */
){
  Fts3Table *p = (Fts3Table *)pVtab;
  sqlite3 *db = p->db;            /* Database connection */
  int rc;                         /* Return Code */

  /* At this point it must be known if the %_stat table exists or not.
  ** So bHasStat may not be 2.  */
  rc = fts3SetHasStat(p);
  
  /* As it happens, the pending terms table is always empty here. This is
  ** because an "ALTER TABLE RENAME TABLE" statement inside a transaction 
  ** always opens a savepoint transaction. And the xSavepoint() method 
  ** flushes the pending terms table. But leave the (no-op) call to
  ** PendingTermsFlush() in in case that changes.
  */
  assert( p->nPendingData==0 );
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts3PendingTermsFlush(p);
  }

  if( p->zContentTbl==0 ){
    fts3DbExec(&rc, db,
      "ALTER TABLE %Q.'%q_content'  RENAME TO '%q_content';",
      p->zDb, p->zName, zName
    );
  }

  if( p->bHasDocsize ){
    fts3DbExec(&rc, db,
      "ALTER TABLE %Q.'%q_docsize'  RENAME TO '%q_docsize';",
      p->zDb, p->zName, zName
    );
  }
  if( p->bHasStat ){
    fts3DbExec(&rc, db,
      "ALTER TABLE %Q.'%q_stat'  RENAME TO '%q_stat';",
      p->zDb, p->zName, zName
    );
  }
  fts3DbExec(&rc, db,
    "ALTER TABLE %Q.'%q_segments' RENAME TO '%q_segments';",
    p->zDb, p->zName, zName
  );
  fts3DbExec(&rc, db,
    "ALTER TABLE %Q.'%q_segdir'   RENAME TO '%q_segdir';",
    p->zDb, p->zName, zName
  );
  return rc;
}